

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall TasGrid::TasmanianSparseGrid::writeBinary(TasmanianSparseGrid *this,ostream *ofs)

{
  bool bVar1;
  pointer pBVar2;
  size_type sVar3;
  char *TSG;
  ostream *ofs_local;
  TasmanianSparseGrid *this_local;
  
  ::std::ostream::write((char *)ofs,0x2fb359);
  bVar1 = isGlobal(this);
  if (bVar1) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'g');
  }
  else {
    bVar1 = isSequence(this);
    if (bVar1) {
      IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'s');
    }
    else {
      bVar1 = isLocalPolynomial(this);
      if (bVar1) {
        IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'p');
      }
      else {
        bVar1 = isWavelet(this);
        if (bVar1) {
          IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'w');
        }
        else {
          bVar1 = isFourier(this);
          if (bVar1) {
            IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'f');
          }
          else {
            IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'e');
          }
        }
      }
    }
  }
  bVar1 = empty(this);
  if (!bVar1) {
    pBVar2 = ::std::
             unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ::operator->(&this->base);
    (*pBVar2->_vptr_BaseCanonicalGrid[8])(pBVar2,ofs,1);
  }
  sVar3 = ::std::vector<double,_std::allocator<double>_>::size(&this->domain_transform_a);
  if (sVar3 == 0) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'y');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,double>(&this->domain_transform_a,ofs);
    IO::writeVector<true,(TasGrid::IO::IOPad)0,double>(&this->domain_transform_b,ofs);
  }
  sVar3 = ::std::vector<int,_std::allocator<int>_>::size(&this->conformal_asin_power);
  if (sVar3 == 0) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'a');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,int>(&this->conformal_asin_power,ofs);
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(&this->llimits);
  if (bVar1) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'y');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,int>(&this->llimits,ofs);
  }
  if ((this->using_dynamic_construction & 1U) == 0) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'s');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'c');
    pBVar2 = ::std::
             unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ::operator->(&this->base);
    (*pBVar2->_vptr_BaseCanonicalGrid[0x1b])(pBVar2,ofs,1);
  }
  IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'e');
  return;
}

Assistant:

void TasmanianSparseGrid::writeBinary(std::ostream &ofs) const{
    const char *TSG = "TSG5"; // last char indicates version (update only if necessary, no need to sync with getVersionMajor())
    ofs.write(TSG, 4 * sizeof(char)); // mark Tasmanian files
    // use Integers to indicate grid types, empty 'e', global 'g', sequence 's', pwpoly 'p', wavelet 'w', Fourier 'f'
    if (isGlobal()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'g');
    }else if (isSequence()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 's');
    }else if (isLocalPolynomial()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'p');
    }else if (isWavelet()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'w');
    }else if (isFourier()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'f');
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'e');
    }
    if (!empty()) base->write(ofs, mode_binary);
    // domain transform: custom 'y', canonical: 'n'
    if (domain_transform_a.size() != 0){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'y');
        IO::writeVector<mode_binary, IO::pad_none>(domain_transform_a, ofs);
        IO::writeVector<mode_binary, IO::pad_none>(domain_transform_b, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    // conformal transforms: none 'n', asin 'a'
    if (conformal_asin_power.size() != 0){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'a');
        IO::writeVector<mode_binary, IO::pad_none>(conformal_asin_power, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    if (!llimits.empty()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'y');
        IO::writeVector<mode_binary, IO::pad_none>(llimits, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    if (using_dynamic_construction){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'c');
        base->writeConstructionData(ofs, mode_binary);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 's');
    }
    IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'e'); // E stands for END
}